

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_SwapWithEmpty_Test::TestBody
          (ExtensionSetTest_SwapWithEmpty_Test *this)

{
  undefined1 local_70 [8];
  TestAllExtensions message2;
  TestAllExtensions message1;
  ExtensionSetTest_SwapWithEmpty_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_70);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>((TestAllExtensions *)local_70)
  ;
  proto2_unittest::TestAllExtensions::Swap
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
             (TestAllExtensions *)local_70);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)local_70);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(ExtensionSetTest, SwapWithEmpty) {
  unittest::TestAllExtensions message1, message2;
  TestUtil::SetAllExtensions(&message1);

  TestUtil::ExpectAllExtensionsSet(message1);
  TestUtil::ExpectExtensionsClear(message2);
  message1.Swap(&message2);
  TestUtil::ExpectAllExtensionsSet(message2);
  TestUtil::ExpectExtensionsClear(message1);
}